

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_frozen::basic_string<char32_t>_&,_const_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>_&>
* __thiscall
Catch::ExprLhs<frozen::basic_string<char32_t>const&>::operator==
          (BinaryExpr<const_frozen::basic_string<char32_t>_&,_const_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>_&>
           *__return_storage_ptr__,ExprLhs<frozen::basic_string<char32_t>const&> *this,
          basic_string_view<char32_t,_std::char_traits<char32_t>_> *rhs)

{
  basic_string<char32_t> *lhs;
  bool comparisonResult;
  StringRef local_30;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *local_20;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *rhs_local;
  ExprLhs<const_frozen::basic_string<char32_t>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)this;
  this_local = (ExprLhs<const_frozen::basic_string<char32_t>_&> *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<frozen::basic_string<char32_t>,std::basic_string_view<char32_t,std::char_traits<char32_t>>>
                 (*(basic_string<char32_t> **)this,rhs);
  lhs = *(basic_string<char32_t> **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_frozen::basic_string<char32_t>_&,_const_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }